

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

void __thiscall
cmGlobalGenerator::CreateGeneratorTargets(cmGlobalGenerator *this,TargetTypes targetTypes)

{
  cmMakefile *pcVar1;
  __uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_> lg;
  __uniq_ptr_data<cmTarget,_std::default_delete<cmTarget>,_true,_true> t;
  bool bVar2;
  undefined4 targetTypes_00;
  pointer puVar3;
  cmGeneratorTarget *this_00;
  mapped_type *ppcVar4;
  pointer puVar5;
  ulong uVar6;
  ulong uVar7;
  pointer puVar8;
  cmGlobalGenerator *pcVar9;
  __single_object gt;
  map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
  importedMap;
  undefined1 local_90 [48];
  undefined1 local_60 [40];
  _Alloc_hider local_38;
  
  local_60._24_8_ = local_60 + 8;
  local_60._8_4_ = _S_red;
  uVar6 = 0;
  local_60._16_8_ = (_Base_ptr)0x0;
  local_38._M_p = (pointer)0x0;
  puVar3 = (this->Makefiles).
           super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pcVar9 = this;
  local_90._12_4_ = targetTypes;
  local_60._32_8_ = local_60._24_8_;
  if ((this->Makefiles).
      super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar3) {
    local_90._24_8_ = this;
    do {
      pcVar1 = puVar3[uVar6]._M_t.
               super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t.
               super__Tuple_impl<0UL,_cmMakefile_*,_std::default_delete<cmMakefile>_>.
               super__Head_base<0UL,_cmMakefile_*,_false>._M_head_impl;
      puVar8 = *(pointer *)
                &(pcVar1->ImportedTargetsOwned).
                 super__Vector_base<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
                 ._M_impl;
      local_90._32_8_ =
           *(pointer *)
            ((long)&(pcVar1->ImportedTargetsOwned).
                    super__Vector_base<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>,_std::allocator<std::unique_ptr<cmTarget,_std::default_delete<cmTarget>_>_>_>
            + 8);
      if (puVar8 != (pointer)local_90._32_8_) {
        do {
          lg._M_t.super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
          .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl =
               (pcVar9->LocalGenerators).
               super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar6]._M_t.
               super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t;
          t.super___uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_>._M_t.
          super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
          super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl =
               (puVar8->_M_t).super___uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_>;
          this_00 = (cmGeneratorTarget *)operator_new(0x8c0);
          cmGeneratorTarget::cmGeneratorTarget
                    (this_00,(cmTarget *)
                             t.super___uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_>._M_t.
                             super__Tuple_impl<0UL,_cmTarget_*,_std::default_delete<cmTarget>_>.
                             super__Head_base<0UL,_cmTarget_*,_false>._M_head_impl,
                     (cmLocalGenerator *)
                     lg._M_t.
                     super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                     .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl);
          local_90._40_8_ =
               (puVar8->_M_t).super___uniq_ptr_impl<cmTarget,_std::default_delete<cmTarget>_>;
          local_90._0_8_ = this_00;
          ppcVar4 = std::
                    map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
                    ::operator[]((map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
                                  *)local_60,(key_type *)(local_90 + 0x28));
          *ppcVar4 = this_00;
          local_90._16_8_ = local_90._0_8_;
          local_90._0_8_ = (_func_int **)0x0;
          cmLocalGenerator::AddOwnedImportedGeneratorTarget
                    ((cmLocalGenerator *)
                     lg._M_t.
                     super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>
                     .super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl,
                     (unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
                     (local_90 + 0x10));
          std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::~unique_ptr
                    ((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
                     (local_90 + 0x10));
          this = (cmGlobalGenerator *)local_90;
          std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::~unique_ptr
                    ((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)this)
          ;
          puVar8 = puVar8 + 1;
          pcVar9 = (cmGlobalGenerator *)local_90._24_8_;
        } while (puVar8 != (pointer)local_90._32_8_);
      }
      uVar6 = (ulong)((int)uVar6 + 1);
      puVar3 = (pcVar9->Makefiles).
               super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar6 < (ulong)((long)(pcVar9->Makefiles).
                                   super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)puVar3 >> 3));
  }
  targetTypes_00 = local_90._12_4_;
  puVar5 = (pcVar9->LocalGenerators).
           super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((pcVar9->LocalGenerators).
      super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != puVar5) {
    uVar6 = 0;
    uVar7 = 1;
    do {
      CreateGeneratorTargets
                (this,targetTypes_00,
                 (cmMakefile *)
                 (pcVar9->Makefiles).
                 super__Vector_base<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>,_std::allocator<std::unique_ptr<cmMakefile,_std::default_delete<cmMakefile>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar6]._M_t.
                 super___uniq_ptr_impl<cmMakefile,_std::default_delete<cmMakefile>_>._M_t,
                 puVar5[uVar6]._M_t.
                 super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
                 super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl,
                 (map<cmTarget_*,_cmGeneratorTarget_*,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
                  *)local_60);
      puVar5 = (pcVar9->LocalGenerators).
               super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar2 = uVar7 < (ulong)((long)(pcVar9->LocalGenerators).
                                    super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar5 >> 3);
      uVar6 = uVar7;
      uVar7 = (ulong)((int)uVar7 + 1);
    } while (bVar2);
  }
  std::
  _Rb_tree<cmTarget_*,_std::pair<cmTarget_*const,_cmGeneratorTarget_*>,_std::_Select1st<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
  ::~_Rb_tree((_Rb_tree<cmTarget_*,_std::pair<cmTarget_*const,_cmGeneratorTarget_*>,_std::_Select1st<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>,_std::less<cmTarget_*>,_std::allocator<std::pair<cmTarget_*const,_cmGeneratorTarget_*>_>_>
               *)local_60);
  return;
}

Assistant:

void cmGlobalGenerator::CreateGeneratorTargets(TargetTypes targetTypes)
{
  std::map<cmTarget*, cmGeneratorTarget*> importedMap;
  for (unsigned int i = 0; i < this->Makefiles.size(); ++i) {
    auto& mf = this->Makefiles[i];
    for (const auto& ownedImpTgt : mf->GetOwnedImportedTargets()) {
      cmLocalGenerator* lg = this->LocalGenerators[i].get();
      auto gt = cm::make_unique<cmGeneratorTarget>(ownedImpTgt.get(), lg);
      importedMap[ownedImpTgt.get()] = gt.get();
      lg->AddOwnedImportedGeneratorTarget(std::move(gt));
    }
  }

  // Construct per-target generator information.
  for (unsigned int i = 0; i < this->LocalGenerators.size(); ++i) {
    this->CreateGeneratorTargets(targetTypes, this->Makefiles[i].get(),
                                 this->LocalGenerators[i].get(), importedMap);
  }
}